

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O3

void __thiscall
gl4cts::DirectStateAccess::Framebuffers::GetParameterErrorsTest::PrepareObjects
          (GetParameterErrorsTest *this)

{
  code *pcVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  deUint32 dVar5;
  GLuint GVar6;
  undefined4 extraout_var;
  long lVar8;
  bool bVar9;
  bool bVar10;
  long lVar7;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  (**(code **)(lVar7 + 0x6d0))(1,&this->m_fbo_valid);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glGenFramebuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1a0f);
  (**(code **)(lVar7 + 0x78))(0x8d40,this->m_fbo_valid);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"glBindFramebuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1a12);
  GVar6 = this->m_parameter_invalid;
  do {
    GVar6 = GVar6 + 1;
    lVar8 = 0;
    bVar2 = false;
    do {
      bVar9 = bVar2;
      bVar10 = *(GLuint *)((long)PrepareObjects::valid_parameters + lVar8) == GVar6;
      lVar8 = lVar8 + 4;
      bVar2 = (bool)(bVar9 | bVar10);
    } while (lVar8 != 0x2c);
  } while (bVar9 || bVar10);
  this->m_parameter_invalid = GVar6;
  do {
    pcVar1 = *(code **)(lVar7 + 0xc88);
    this->m_fbo_invalid = this->m_fbo_invalid + 1;
    cVar3 = (*pcVar1)();
  } while (cVar3 != '\0');
  return;
}

Assistant:

void GetParameterErrorsTest::PrepareObjects()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Valid objects. */
	gl.genFramebuffers(1, &m_fbo_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers has failed");

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

	/* Invalid target. */
	bool is_parameter = true;

	while (is_parameter)
	{
		is_parameter = false;

		++m_parameter_invalid;

		static const glw::GLenum valid_parameters[] = { GL_FRAMEBUFFER_DEFAULT_WIDTH,
														GL_FRAMEBUFFER_DEFAULT_HEIGHT,
														GL_FRAMEBUFFER_DEFAULT_LAYERS,
														GL_FRAMEBUFFER_DEFAULT_SAMPLES,
														GL_FRAMEBUFFER_DEFAULT_FIXED_SAMPLE_LOCATIONS,
														GL_DOUBLEBUFFER,
														GL_IMPLEMENTATION_COLOR_READ_FORMAT,
														GL_IMPLEMENTATION_COLOR_READ_TYPE,
														GL_SAMPLES,
														GL_SAMPLE_BUFFERS,
														GL_STEREO };

		static const glw::GLuint valid_parameters_count = sizeof(valid_parameters) / sizeof(valid_parameters[0]);

		for (glw::GLuint i = 0; i < valid_parameters_count; ++i)
		{
			if (valid_parameters[i] == m_parameter_invalid)
			{
				is_parameter = true;
			}
		}
	}

	/* Invalid objects. */
	while (gl.isFramebuffer(++m_fbo_invalid))
		;
}